

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix2 * matrix2_rotate(matrix2 *self,double angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = cos(angle);
  dVar6 = sin(angle);
  dVar1 = (self->field_0).m[2];
  dVar2 = (self->field_0).m[0];
  dVar3 = (self->field_0).m[1];
  dVar4 = (self->field_0).m[3];
  (self->field_0).m[0] = dVar2 * dVar5 + dVar6 * dVar1;
  (self->field_0).m[1] = dVar3 * dVar5 + dVar6 * dVar4;
  (self->field_0).m[2] = dVar1 * dVar5 - dVar2 * dVar6;
  (self->field_0).m[3] = dVar5 * dVar4 - dVar3 * dVar6;
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_rotate(struct matrix2 *self, HYP_FLOAT angle)
{
	struct matrix2 rotationMatrix;

	return matrix2_multiply(self,
		matrix2_make_transformation_rotationf_z(&rotationMatrix, angle));
}